

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::IsUnboundedFunction::IsUnboundedFunction(IsUnboundedFunction *this)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,IsUnbounded,Function);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_006b3b10;
  return;
}

Assistant:

IsUnboundedFunction() :
        SystemSubroutine(KnownSystemName::IsUnbounded, SubroutineKind::Function) {}